

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

uint256 * __thiscall
node::anon_unknown_2::NodeImpl::getBestBlockHash(uint256 *__return_storage_ptr__,NodeImpl *this)

{
  pointer ppCVar1;
  ChainstateManager *pCVar2;
  Chainstate *pCVar3;
  CBlockIndex *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
             ,0x137,false);
  pCVar2 = chainman(this);
  pCVar3 = ChainstateManager::ActiveChainstate(pCVar2);
  ppCVar1 = (pCVar3->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (pCVar3->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this_00 = (CBlockIndex *)0x0;
  }
  else {
    this_00 = ppCVar1[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (this_00 == (CBlockIndex *)0x0) {
    pCVar2 = chainman(this);
    CBlockHeader::GetHash
              (__return_storage_ptr__,
               &(((pCVar2->m_options).chainparams)->genesis).super_CBlockHeader);
  }
  else {
    CBlockIndex::GetBlockHash(__return_storage_ptr__,this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 getBestBlockHash() override
    {
        const CBlockIndex* tip = WITH_LOCK(::cs_main, return chainman().ActiveChain().Tip());
        return tip ? tip->GetBlockHash() : chainman().GetParams().GenesisBlock().GetHash();
    }